

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataCube.cpp
# Opt level: O0

void __thiscall DataCube::DataCube(DataCube *this,shared_ptr<Launcher> *launcher)

{
  undefined8 *in_RDI;
  Launcher *in_stack_ffffffffffffff88;
  Application *in_stack_ffffffffffffff90;
  shared_ptr<QueryCompiler> *this_00;
  shared_ptr<QueryCompiler> local_20 [2];
  
  Application::Application(in_stack_ffffffffffffff90);
  *in_RDI = &PTR__DataCube_0037fae8;
  std::__cxx11::string::string((string *)(in_RDI + 10));
  std::shared_ptr<QueryCompiler>::shared_ptr((shared_ptr<QueryCompiler> *)0x252762);
  std::shared_ptr<TreeDecomposition>::shared_ptr((shared_ptr<TreeDecomposition> *)0x252775);
  in_RDI[0x12] = 0;
  std::bitset<100UL>::bitset((bitset<100UL> *)0x252791);
  std::__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x25279b);
  Launcher::getCompiler(in_stack_ffffffffffffff88);
  this_00 = local_20;
  std::shared_ptr<QueryCompiler>::operator=
            (this_00,(shared_ptr<QueryCompiler> *)in_stack_ffffffffffffff88);
  std::shared_ptr<QueryCompiler>::~shared_ptr((shared_ptr<QueryCompiler> *)0x2527cc);
  std::__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x2527d6);
  Launcher::getTreeDecomposition(in_stack_ffffffffffffff88);
  std::shared_ptr<TreeDecomposition>::operator=
            ((shared_ptr<TreeDecomposition> *)this_00,
             (shared_ptr<TreeDecomposition> *)in_stack_ffffffffffffff88);
  std::shared_ptr<TreeDecomposition>::~shared_ptr((shared_ptr<TreeDecomposition> *)0x252805);
  return;
}

Assistant:

DataCube::DataCube(shared_ptr<Launcher> launcher) 
{
    _compiler = launcher->getCompiler();
    _td = launcher->getTreeDecomposition();
}